

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O1

void Syn_Filt(tetra_codec *st,Word16 *a,Word16 *x,Word16 *y,Word16 lg,Word16 *mem,Word16 update)

{
  undefined8 *puVar1;
  undefined6 in_register_00000082;
  undefined8 *puVar2;
  long lVar3;
  undefined2 *puVar4;
  undefined2 uVar5;
  long lVar6;
  ushort uVar7;
  short *psVar8;
  uint uVar9;
  uint uVar10;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined4 local_c8;
  undefined2 local_c4 [74];
  
  puVar2 = (undefined8 *)CONCAT62(in_register_00000082,lg);
  puVar1 = &local_d8;
  local_c8 = *(undefined4 *)(puVar2 + 2);
  local_d8 = *puVar2;
  uStack_d0 = puVar2[1];
  lVar3 = 0;
  puVar4 = local_c4;
  do {
    uVar9 = (int)x[lVar3] << 0xc;
    lVar6 = 0x14;
    psVar8 = a + 1;
    do {
      uVar10 = uVar9 - (int)*(short *)((long)puVar1 + lVar6 + -2) * (int)*psVar8;
      if (((int)((int)*(short *)((long)puVar1 + lVar6 + -2) * (int)*psVar8 ^ uVar9) < 0) &&
         ((int)(uVar10 ^ uVar9) < 0)) {
        st->Overflow = 1;
        uVar10 = 0x7fffffff - ((int)uVar9 >> 0x1f);
      }
      uVar9 = uVar10;
      psVar8 = psVar8 + 1;
      lVar6 = lVar6 + -2;
    } while (lVar6 != 0);
    uVar10 = uVar9 + 0x800;
    if ((int)(uVar9 ^ uVar10) < 0 && -1 < (int)uVar9) {
      st->Overflow = 1;
      uVar10 = 0x7fffffff;
    }
    uVar7 = 5;
    do {
      if (0x3fffffff < (int)uVar10) {
        st->Overflow = 1;
        uVar5 = 0x7fff;
        goto LAB_00106454;
      }
      if ((int)uVar10 < -0x40000000) {
        st->Overflow = 1;
        uVar5 = 0x8000;
        goto LAB_00106454;
      }
      uVar10 = uVar10 * 2;
      uVar7 = uVar7 - 1;
    } while (1 < uVar7);
    uVar5 = (undefined2)(uVar10 >> 0x10);
LAB_00106454:
    *puVar4 = uVar5;
    puVar4 = puVar4 + 1;
    lVar3 = lVar3 + 1;
    puVar1 = (undefined8 *)((long)puVar1 + 2);
    if (lVar3 == 0x3c) {
      memcpy(y,local_c4,0x78);
      if ((short)mem != 0) {
        lVar3 = 0;
        do {
          *(Word16 *)((long)puVar2 + lVar3 * 2) = y[lVar3 + 0x32];
          lVar3 = lVar3 + 1;
        } while (lVar3 != 10);
      }
      return;
    }
  } while( true );
}

Assistant:

void Syn_Filt(tetra_codec* st, Word16 a[], Word16 x[], Word16 y[], Word16 lg, Word16 mem[],
              Word16 update)
{
  Word16 i, j;
  Word32 s;
  Word16 tmp[80];	/* This is usually done by memory allocation (lg+TSC_pp) */
  Word16 *yy;

  /* Copy mem[] to yy[] */

  yy = tmp;

  for(i=0; i<TSC_pp; i++)
    *yy++ = mem[i];


  /* Do the filtering. */

  for (i = 0; i < lg; i++)
  {
    s = Load_sh(st, x[i], (Word16)12);				/* a[] is in Q12 */
    for (j = 1; j <= TSC_pp; j++)
      s = L_msu0(st, s, a[j], yy[-j]);

    s     = add_sh(st, s, (Word16)1, (Word16)11);		/* Rounding */
    *yy++ = extract_h( L_shl(st, s, (Word16)4) );
  }

  for(i=0; i<lg; i++) y[i] = tmp[i+TSC_pp];

  /* Update of memory if update==1 */

  if(update != 0)
     for (i = 0; i < TSC_pp; i++) mem[i] = y[lg-TSC_pp+i];

 return;
}